

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void gen_step_complete_exception(DisasContext_conflict1 *s)

{
  TCGContext_conflict1 *s_00;
  TCGTemp *ts;
  
  if (s->ss_active == true) {
    s_00 = s->uc->tcg_ctx;
    s->pstate_ss = false;
    ts = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i32,(TCGArg)ts,(TCGArg)(s_00->cpu_env + (long)s_00),0x148);
    tcg_gen_andi_i32_aarch64
              (s_00,(TCGv_i32)((long)ts - (long)s_00),(TCGv_i32)((long)ts - (long)s_00),-0x200001);
    tcg_gen_op3_aarch64(s_00,INDEX_op_st_i32,(TCGArg)ts,(TCGArg)(s_00->cpu_env + (long)s_00),0x148);
    tcg_temp_free_internal_aarch64(s_00,ts);
  }
  gen_swstep_exception(s,1,(uint)s->is_ldex);
  (s->base).is_jmp = DISAS_NORETURN;
  return;
}

Assistant:

static void gen_step_complete_exception(DisasContext *s)
{
    /* We just completed step of an insn. Move from Active-not-pending
     * to Active-pending, and then also take the swstep exception.
     * This corresponds to making the (IMPDEF) choice to prioritize
     * swstep exceptions over asynchronous exceptions taken to an exception
     * level where debug is disabled. This choice has the advantage that
     * we do not need to maintain internal state corresponding to the
     * ISV/EX syndrome bits between completion of the step and generation
     * of the exception, and our syndrome information is always correct.
     */
    gen_ss_advance(s);
    gen_swstep_exception(s, 1, s->is_ldex);
    s->base.is_jmp = DISAS_NORETURN;
}